

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_subset(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  size_t sVar2;
  undefined4 *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *val;
  vm_val_t ele;
  vm_rcdesc rc;
  CVmObjList *new_lst_obj;
  char *new_lst;
  size_t cnt;
  size_t dst;
  size_t src;
  vm_val_t *func_val;
  uint orig_argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff18;
  vm_val_t *lst_00;
  vm_val_t *in_stack_ffffffffffffff20;
  vm_val_t *this;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 uVar3;
  unsigned_short method_idx;
  vm_val_t *in_stack_ffffffffffffff30;
  uint argc_00;
  vm_val_t *in_stack_ffffffffffffff38;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff40;
  ulong local_40;
  
  if (in_RCX == (undefined4 *)0x0) {
    uVar3 = 0;
    method_idx = 0;
  }
  else {
    uVar3 = (undefined2)*in_RCX;
    method_idx = (unsigned_short)((uint)*in_RCX >> 0x10);
  }
  if ((getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_subset::desc,1);
    __cxa_guard_release(&getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT26(method_idx,CONCAT24(uVar3,in_stack_ffffffffffffff28)),
                     &in_stack_ffffffffffffff20->typ,in_stack_ffffffffffffff18);
  if (iVar1 == 0) {
    lst_00 = in_RSI;
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)in_stack_ffffffffffffff40.native_desc,(char *)in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30,method_idx,in_stack_ffffffffffffff20,
               (int)((ulong)lst_00 >> 0x20));
    CVmStack::get(0);
    CVmStack::push(in_RSI);
    this = in_RDI;
    obj = create((int)((ulong)in_RDI >> 0x20),(char *)lst_00);
    vm_val_t::set_obj(this,obj);
    vm_objp(0);
    sVar2 = vmb_get_len((char *)0x36c77a);
    CVmStack::push(in_RDI);
    for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
      index_list(in_stack_ffffffffffffff30,
                 (char *)CONCAT26(method_idx,CONCAT24(uVar3,in_stack_ffffffffffffff28)),
                 (uint)((ulong)this >> 0x20));
      argc_00 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      CVmStack::push((vm_val_t *)&stack0xffffffffffffff38);
      CVmRun::call_func_ptr
                ((CVmRun *)in_stack_ffffffffffffff40.native_desc,in_stack_ffffffffffffff38,argc_00,
                 (vm_rcdesc *)CONCAT26(method_idx,CONCAT24(uVar3,in_stack_ffffffffffffff28)),
                 (uint)((ulong)this >> 0x20));
      in_stack_ffffffffffffff30 = CVmRun::get_r0();
      if ((in_stack_ffffffffffffff30->typ != VM_NIL) &&
         ((in_stack_ffffffffffffff30->typ != VM_INT || ((in_stack_ffffffffffffff30->val).obj != 0)))
         ) {
        cons_set_element((CVmObjList *)this,(size_t)lst_00,(vm_val_t *)0x36c84d);
      }
    }
    cons_set_len((CVmObjList *)this,(size_t)lst_00);
    CVmStack::discard(3);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_subset(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                            const char *lst, uint *argc)
{
    uint orig_argc = (argc != 0 ? *argc : 0);
    const vm_val_t *func_val;
    size_t src;
    size_t dst;
    size_t cnt;
    char *new_lst;
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up the recursive caller context */
    vm_rcdesc rc(vmg_ "List.subset", self_val, 1, G_stk->get(0), orig_argc);

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value.  The result value
     *   will be at most the same size as our current list; since we have
     *   no way of knowing exactly how large it will be, and since we
     *   don't want to run through the selection functions twice, we'll
     *   just allocate at the maximum size and leave it partially unused
     *   if we don't need all of the space.  By making a copy of the input
     *   list, we also can avoid worrying about whether the input list was
     *   a constant, and hence we don't have to worry about the
     *   possibility of constant page swapping.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    new_lst = new_lst_obj->ext_;

    /* get the length of the list */
    cnt = vmb_get_len(new_lst);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  If the element passes, write it to the current
     *   output location in the list; otherwise, just skip it.
     *   
     *   Note that we're using the same list as source and destination,
     *   which is easy because the list will either shrink or stay the
     *   same - we'll never need to insert new elements.  
     */
    for (src = dst = 0 ; src < cnt ; ++src)
    {
        vm_val_t ele;
        const vm_val_t *val;
        
        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_list(vmg_ &ele, new_lst, src + 1);
        G_stk->push(&ele);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* 
         *   if the callback returned non-nil and non-zero, include this
         *   element in the result 
         */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* include this element in the result */
            new_lst_obj->cons_set_element(dst, &ele);

            /* advance the output index */
            ++dst;
        }
    }

    /* 
     *   set the result list length to the number of elements we actually
     *   copied 
     */
    new_lst_obj->cons_set_len(dst);

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}